

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

void emulator_get_opcode_mnemonic(u16 opcode,char *buffer,size_t size)

{
  int iVar1;
  char *__s1;
  char *__dest;
  char *local_68;
  char *src;
  char *dst;
  char fmt [32];
  byte local_29;
  char *pcStack_28;
  u8 num_bytes;
  char *orig_fmt;
  size_t size_local;
  char *buffer_local;
  u16 opcode_local;
  
  local_29 = 1;
  if (opcode < 0x100) {
    local_29 = s_opcode_bytes[opcode];
    pcStack_28 = s_opcode_mnemonic[opcode];
  }
  else {
    if ((opcode & 0xff00) != 0xcb00) {
      __assert_fail("(opcode & 0xff00) == 0xcb00",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                    ,0xfb,"void emulator_get_opcode_mnemonic(u16, char *, size_t)");
    }
    pcStack_28 = s_cb_opcode_mnemonic[(int)(opcode & 0xff)];
  }
  local_68 = pcStack_28;
  src = (char *)&dst;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                if (*local_68 == '\0') {
                  *src = '\0';
                  if (local_29 < 2) {
                    strncpy(buffer,(char *)&dst,size);
                  }
                  else if (local_29 == 2) {
                    snprintf(buffer,size,(char *)&dst,"XX");
                  }
                  else if (local_29 == 3) {
                    snprintf(buffer,size,(char *)&dst,"XXXX");
                  }
                  return;
                }
                if (*local_68 == '%') break;
                *src = *local_68;
                local_68 = local_68 + 1;
                src = src + 1;
              }
              __s1 = local_68 + 1;
              __dest = src + 1;
              *src = *local_68;
              iVar1 = strncmp(__s1,"hu",2);
              if (iVar1 != 0) break;
              *__dest = '\0';
              strncat(__dest,"4s",(size_t)(fmt + (0x17 - (long)__dest)));
              src = src + 3;
              local_68 = local_68 + 3;
            }
            iVar1 = strncmp(__s1,"hhu",3);
            if (iVar1 != 0) break;
            *__dest = '\0';
            strncat(__dest,"-2s",(size_t)(fmt + (0x17 - (long)__dest)));
            src = src + 4;
            local_68 = local_68 + 4;
          }
          iVar1 = strncmp(__s1,"04x",3);
          if (iVar1 != 0) break;
          *__dest = '\0';
          strncat(__dest,"-4s",(size_t)(fmt + (0x17 - (long)__dest)));
          src = src + 4;
          local_68 = local_68 + 4;
        }
        iVar1 = strncmp(__s1,"+hhd",4);
        if (iVar1 != 0) break;
        *__dest = '\0';
        strncat(__dest,"2.2s",(size_t)(fmt + (0x17 - (long)__dest)));
        src = src + 5;
        local_68 = local_68 + 5;
      }
      iVar1 = strncmp(__s1,"04hx",4);
      if (iVar1 != 0) break;
      *__dest = '\0';
      strncat(__dest,"4.4s",(size_t)(fmt + (0x17 - (long)__dest)));
      src = src + 5;
      local_68 = local_68 + 5;
    }
    iVar1 = strncmp(__s1,"02hhx",5);
    if (iVar1 != 0) break;
    *__dest = '\0';
    strncat(__dest,"-2.2s",(size_t)(fmt + (0x17 - (long)__dest)));
    src = src + 6;
    local_68 = local_68 + 6;
  }
  abort();
}

Assistant:

void emulator_get_opcode_mnemonic(u16 opcode, char* buffer, size_t size) {
  const char* orig_fmt;
  u8 num_bytes = 1;
  if (opcode >= 0x100) {
    assert((opcode & 0xff00) == 0xcb00);
    orig_fmt = s_cb_opcode_mnemonic[opcode & 0xff];
  } else {
    num_bytes = s_opcode_bytes[opcode];
    orig_fmt = s_opcode_mnemonic[opcode];
  }
  char fmt[32];
  char* dst = fmt;
  const char* src;
  for (src = orig_fmt; *src;) {
    if (*src == '%') {
      *dst++ = *src++;

      /* Replace the format specifier with a string so we can print XXXX
       * instead of numbers. This is super hacky, but eh. */

#define START if (0) ;
#define END else abort();
#define REPLACE(old, new, len)                       \
  else if (strncmp(src, old, len) == 0) {            \
    *dst = 0; /* NULL-terminate so strncat works. */ \
    strncat(dst, new, fmt + sizeof(fmt) - dst - 1);  \
    dst += len;                                      \
    src += len;                                      \
  }

      START
      REPLACE("hu", "4s", 2)
      REPLACE("hhu", "-2s", 3)
      REPLACE("04x", "-4s", 3)
      REPLACE("+hhd", "2.2s", 4)
      REPLACE("04hx", "4.4s", 4)
      REPLACE("02hhx", "-2.2s", 5)
      END

#undef START
#undef END
#undef REPLACE
    } else {
      *dst++ = *src++;
    }
  }